

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O3

uint __thiscall Network::compute_triangles(Network *this,uint node_i)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  pointer psVar3;
  _Rb_tree_node_base *p_Var4;
  iterator __begin2;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  uint uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  iterator __end2;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  
  psVar3 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var11 = &psVar3[node_i]._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = *(_Base_ptr *)((long)&psVar3[node_i]._M_t._M_impl.super__Rb_tree_header + 0x10);
  uVar8 = 0;
  p_Var6 = p_Var4;
  if (p_Var4 != p_Var11) {
    do {
      _Var1 = p_Var6[1]._M_color;
      p_Var12 = &psVar3[_Var1]._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = p_Var4;
      do {
        _Var2 = p_Var5[1]._M_color;
        if (_Var2 != _Var1) {
          p_Var9 = *(_Base_ptr *)((long)&psVar3[_Var1]._M_t._M_impl.super__Rb_tree_header + 8);
          p_Var7 = &p_Var12->_M_header;
          p_Var10 = p_Var12;
          if (p_Var9 != (_Base_ptr)0x0) {
            do {
              bVar13 = (_Rb_tree_color)*(size_t *)(p_Var9 + 1) < _Var2;
              if (!bVar13) {
                p_Var7 = p_Var9;
              }
              p_Var9 = (&p_Var9->_M_left)[bVar13];
            } while (p_Var9 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var7 != p_Var12) &&
               (p_Var10 = (_Rb_tree_header *)p_Var7,
               _Var2 < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var10 = p_Var12;
            }
          }
          uVar8 = uVar8 + (p_Var10 != p_Var12);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != p_Var11);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var11);
    uVar8 = uVar8 >> 1;
  }
  return uVar8;
}

Assistant:

unsigned int compute_triangles(unsigned int node_i) const {
        unsigned int triangles = 0;
        for (unsigned int node_j : links[node_i])
            for (unsigned int node_k : links[node_i])
                if (node_k != node_j and links[node_j].count(node_k))
                    triangles++;
        return triangles/2;
    }